

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

ImGuiTableColumnFlags ImGui::TableGetColumnFlags(int column_n)

{
  ImGuiTable *pIVar1;
  ImGuiTableColumn *pIVar2;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 == (ImGuiTable *)0x0) {
    return 0;
  }
  if (column_n < 0) {
    column_n = pIVar1->CurrentColumn;
  }
  if (column_n == pIVar1->ColumnsCount) {
    return (uint)(column_n == pIVar1->HoveredColumnBody) << 0x1b;
  }
  if ((-1 < column_n) &&
     (pIVar2 = (pIVar1->Columns).Data + column_n, pIVar2 < (pIVar1->Columns).DataEnd)) {
    return pIVar2->Flags;
  }
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_internal.h"
                ,0x24a,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
}

Assistant:

ImGuiTableColumnFlags ImGui::TableGetColumnFlags(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return ImGuiTableColumnFlags_None;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    if (column_n == table->ColumnsCount)
        return (table->HoveredColumnBody == column_n) ? ImGuiTableColumnFlags_IsHovered : ImGuiTableColumnFlags_None;
    return table->Columns[column_n].Flags;
}